

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O0

void __thiscall
std::pmr::test_resource::do_deallocate(test_resource *this,void *p,size_t bytes,size_t alignment)

{
  memory_resource *this_00;
  lock_guard<std::mutex> lVar1;
  bool bVar2;
  AlignedHeader *address;
  char *pcVar3;
  Link *__p;
  size_type sVar4;
  const_pointer pvVar5;
  bool bVar6;
  char *local_228;
  byte *pc_1;
  byte *tail;
  byte *pc;
  byte *pcEnd;
  byte *pcBegin;
  int underrunBy;
  int overrunBy;
  longlong allocationIndex;
  size_t size;
  bool paramError;
  bool miscError;
  AlignedHeader *head;
  lock_guard<std::mutex> local_1c8;
  lock_guard<std::mutex> guard;
  size_t alignment_local;
  size_t bytes_local;
  void *p_local;
  test_resource *this_local;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  guard._M_device = (mutex_type *)alignment;
  lock_guard<std::mutex>::lock_guard(&local_1c8,&this->m_lock_);
  LOCK();
  (this->m_deallocations_).super___atomic_base<long_long>._M_i =
       (this->m_deallocations_).super___atomic_base<long_long>._M_i + 1;
  UNLOCK();
  atomic<void_*>::store(&this->m_last_deallocated_address_,p,memory_order_relaxed);
  if (p == (void *)0x0) {
    if (bytes == 0) {
      operator&(memory_order_relaxed,__memory_order_mask);
      lVar1 = guard;
      (this->m_last_deallocated_num_bytes_).super___atomic_base<unsigned_long>._M_i = 0;
      operator&(memory_order_relaxed,__memory_order_mask);
      (this->m_last_deallocated_alignment_).super___atomic_base<unsigned_long>._M_i =
           (__int_type_conflict1)lVar1._M_device;
    }
    else {
      LOCK();
      (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i =
           (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i + 1;
      UNLOCK();
      bVar2 = is_quiet(this);
      if (!bVar2) {
        formatBadBytesForNullptr(bytes,(size_t)guard._M_device);
        bVar2 = is_no_abort(this);
        if (!bVar2) {
          abort();
        }
      }
    }
  }
  else {
    address = (AlignedHeader *)((long)p + -0x40);
    bVar2 = false;
    allocationIndex = 0;
    _underrunBy = 0xffffffffffffffff;
    if ((address->m_object_).m_magic_number_ == 0xdeadbeef) {
      bVar6 = this == *(test_resource **)((long)p + -0x18);
      if (bVar6) {
        allocationIndex = *(longlong *)((long)p + -0x38);
        _underrunBy = *(undefined8 *)((long)p + -0x28);
      }
      size._7_1_ = !bVar6;
    }
    else {
      size._7_1_ = true;
    }
    pcBegin._4_4_ = 0;
    pcBegin._0_4_ = 0;
    if (!size._7_1_) {
      for (tail = (byte *)((long)p + -1); (byte *)((long)p - 0x10U) <= tail; tail = tail + -1) {
        if (*tail != 0xb1) {
          pcBegin._0_4_ = ((int)(byte *)((long)p + -1) + 1) - (int)tail;
          break;
        }
      }
      if ((int)pcBegin == 0) {
        pcVar3 = (char *)((long)p + allocationIndex);
        for (local_228 = pcVar3; local_228 < pcVar3 + 0x10; local_228 = local_228 + 1) {
          if (*local_228 != -0x4f) {
            pcBegin._4_4_ = ((int)local_228 + 1) - (int)pcVar3;
            break;
          }
        }
      }
      if ((bytes != allocationIndex) || (guard._M_device != *(mutex_type **)((long)p + -0x30))) {
        bVar2 = true;
      }
    }
    if ((((size._7_1_) || (pcBegin._4_4_ != 0)) || ((int)pcBegin != 0)) || (bVar2)) {
      if (size._7_1_) {
        LOCK();
        (this->m_mismatches_).super___atomic_base<long_long>._M_i =
             (this->m_mismatches_).super___atomic_base<long_long>._M_i + 1;
        UNLOCK();
      }
      if (bVar2) {
        LOCK();
        (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i =
             (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i + 1;
        UNLOCK();
      }
      if ((pcBegin._4_4_ != 0) || ((int)pcBegin != 0)) {
        LOCK();
        (this->m_bounds_errors_).super___atomic_base<long_long>._M_i =
             (this->m_bounds_errors_).super___atomic_base<long_long>._M_i + 1;
        UNLOCK();
      }
      bVar2 = is_quiet(this);
      if (!bVar2) {
        formatInvalidMemoryBlock
                  (address,bytes,(size_t)guard._M_device,this,(int)pcBegin,pcBegin._4_4_);
        bVar2 = is_no_abort(this);
        if (!bVar2) {
          abort();
        }
      }
    }
    else {
      this_00 = this->m_pmr_;
      __p = removeLink(this->m_list_,*(Link **)((long)p + -0x20));
      memory_resource::deallocate(this_00,__p,0x18,8);
      operator&(memory_order_relaxed,__memory_order_mask);
      lVar1 = guard;
      (this->m_last_deallocated_num_bytes_).super___atomic_base<unsigned_long>._M_i =
           allocationIndex;
      operator&(memory_order_relaxed,__memory_order_mask);
      (this->m_last_deallocated_alignment_).super___atomic_base<unsigned_long>._M_i =
           (__int_type_conflict1)lVar1._M_device;
      LOCK();
      (this->m_blocks_in_use_).super___atomic_base<long_long>._M_i =
           (this->m_blocks_in_use_).super___atomic_base<long_long>._M_i + -1;
      UNLOCK();
      LOCK();
      (this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i =
           (this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i - allocationIndex;
      UNLOCK();
      (address->m_object_).m_magic_number_ = 0xdeadf00d;
      memset(p,0xa5,allocationIndex);
      bVar2 = is_verbose(this);
      if (bVar2) {
        printf("test_resource");
        bVar2 = basic_string_view<char,_std::char_traits<char>_>::empty(&this->m_name_);
        if (!bVar2) {
          sVar4 = basic_string_view<char,_std::char_traits<char>_>::length(&this->m_name_);
          pvVar5 = basic_string_view<char,_std::char_traits<char>_>::data(&this->m_name_);
          printf(" %.*s",sVar4 & 0xffffffff,pvVar5);
        }
        pcVar3 = "s ";
        if (allocationIndex == 1) {
          pcVar3 = " ";
        }
        printf(" [%lld]: Deallocated %zu byte%s(aligned %zu) at %p.\n",_underrunBy,allocationIndex,
               pcVar3,guard._M_device,p);
        fflush(_stdout);
      }
      memory_resource::deallocate(this->m_pmr_,address,allocationIndex + 0x50,0x10);
    }
  }
  lock_guard<std::mutex>::~lock_guard(&local_1c8);
  return;
}

Assistant:

void test_resource::do_deallocate(void *p, size_t bytes, size_t alignment)
{
    lock_guard guard{ m_lock_ };

    m_deallocations_.fetch_add(1, memory_order_relaxed);
    m_last_deallocated_address_.store(p, memory_order_relaxed);

    if (nullptr == p) {
        if (0 != bytes) {
            m_bad_deallocate_params_.fetch_add(1, memory_order_relaxed);
            if (!is_quiet()) {
                formatBadBytesForNullptr(bytes, alignment);
                if (!is_no_abort()) {
                    std::abort();                                      // ABORT
                }
            }
        }
        else {
            m_last_deallocated_num_bytes_.store(0,
                                                memory_order_relaxed);
            m_last_deallocated_alignment_.store(alignment,
                                                memory_order_relaxed);
        }
        return;                                                       // RETURN
    }

    AlignedHeader *head = (AlignedHeader *)p - 1;

    bool miscError  = false;
    bool paramError = false;

    size_t     size            = 0;
    long long  allocationIndex = -1;

    // The following checks are done deliberately in the order shown to avoid a
    // possible bus error when attempting to read a misaligned 64-bit integer,
    // which can happen if an invalid address is passed to this method.  If the
    // address of the memory being deallocated is misaligned, it is very likely
    // that 'm_magic_number_' will not match the expected value, and so we will
    // skip the reading of 'm_bytes_' (a 64-bit integer).

    if (allocatedMemoryPattern != head->m_object_.m_magic_number_) {
        miscError = true;
    }
    else if (this != head->m_object_.m_pmr_) {
        miscError = true;
    }
    else {
        size            = head->m_object_.m_bytes_;
        allocationIndex = head->m_object_.m_index_;
    }

    // If there is evidence of corruption, this memory may have already been
    // freed.  On some platforms (but not others), the 'free' function will
    // scribble freed memory.  To get uniform behavior for test drivers, we
    // deliberately don't check over/underruns if 'miscError' is 'true'.

    int overrunBy  = 0;
    int underrunBy = 0;

    if (!miscError) {
        byte *pcBegin;
        byte *pcEnd;

        // Check the padding before the segment.  Go backwards so we will
        // report the trashed byte nearest the segment.

        pcBegin = (byte *)p - 1;
        pcEnd   = (byte *)&head->m_object_.m_padding_;

        for (byte *pc = pcBegin; pcEnd <= pc; --pc) {
            if (paddedMemoryByte != *pc) {
                underrunBy = static_cast<int>(pcBegin + 1 - pc);
                break;
            }
        }

        if (!underrunBy) {
            // Check the padding after the segment.

            byte *tail = (byte *)p + size;
            pcBegin = tail;
            pcEnd = tail + paddingSize;
            for (byte *pc = pcBegin; pc < pcEnd; ++pc) {
                if (paddedMemoryByte != *pc) {
                    overrunBy = static_cast<int>(pc + 1 - pcBegin);
                    break;
                }
            }
        }

        if (bytes != size || alignment != head->m_object_.m_alignment_) {
            paramError = true;
        }
    }

    // Now check for corrupted memory block and cross allocation.

    if (!miscError && !overrunBy && !underrunBy &&!paramError) {
        m_pmr_->deallocate(removeLink(m_list_,
                                      head->m_object_.m_address_),
                           sizeof(Link), alignof(Link));
    }
    else { // Any error, count it, report it
        if (miscError) {
            m_mismatches_.fetch_add(1, memory_order_relaxed);
        }
        if (paramError) {
            m_bad_deallocate_params_.fetch_add(1, memory_order_relaxed);
        }
        if (overrunBy || underrunBy) {
            m_bounds_errors_.fetch_add(1, memory_order_relaxed);
        }

        if (is_quiet()) {
            return;                                                   // RETURN
        }
        else {
            formatInvalidMemoryBlock(head, bytes, alignment,
                                     this, underrunBy, overrunBy);
            if (is_no_abort()) {
                return;                                               // RETURN
            }
            else {
                std::abort();                                          // ABORT
            }
        }
    }

    // At this point we know (almost) for sure that the memory block is
    // currently allocated from this object.  We now proceed to update our
    // statistics, stamp the block's header as deallocated, scribble over its
    // payload, and give it back to the underlying allocator supplied at
    // construction.  In verbose mode, we also report the deallocation event to
    // 'stdout'.

    m_last_deallocated_num_bytes_.store(static_cast<long long>(size),
                                        memory_order_relaxed);
    m_last_deallocated_alignment_.store(static_cast<long long>(alignment),
                                        memory_order_relaxed);

    m_blocks_in_use_.fetch_add(-1, memory_order_relaxed);

    m_bytes_in_use_.fetch_add(-static_cast<long long>(size),
                              memory_order_relaxed);

    head->m_object_.m_magic_number_ = deallocatedMemoryPattern;

    std::memset(p, static_cast<int>(scribbledMemoryByte), size);

    if (is_verbose()) {

        // In verbose mode, print a message to 'stdout' -- e.g.,
        //..
        //  TestAllocator local [245]: Deallocated 1 byte at 0x3c1b2740.
        //..

        printf("test_resource");

        if (!m_name_.empty()) {
            printf(" %.*s",
                   static_cast<int>(m_name_.length()), m_name_.data());
        }

        printf(" [%lld]: Deallocated %zu byte%s(aligned %zu) at %p.\n",
               allocationIndex,
               size,
               1 == size ? " " : "s ",
               alignment,
               p);

        std::fflush(stdout);
    }

    m_pmr_->deallocate(head, sizeof(AlignedHeader) + size + paddingSize);
}